

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
jessilib::
word_split_once<std::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*,char_const*>
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end,char *in_whitespace_begin,char *in_whitespace_end)

{
  bool bVar1;
  difference_type dVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_00;
  char in_whitespace;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  bool local_112;
  bool local_111;
  size_t local_f0;
  char *local_e8;
  size_t local_d0;
  char *local_c8;
  size_t local_b0;
  char *local_a8;
  __unspec local_9a;
  type local_99;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  itr;
  anon_class_16_2_5d41347b is_whitespace;
  size_t local_70;
  char *local_68;
  __unspec local_5a;
  type local_59;
  undefined1 local_58 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  result;
  char *in_whitespace_end_local;
  char *in_whitespace_begin_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin_local;
  
  in_whitespace = (char)in_whitespace_begin;
  in_whitespace_begin_local = begin._M_current;
  end_local._M_current = (char *)this;
  dVar2 = std::distance<char_const*>(end._M_current,in_whitespace_begin);
  if (dVar2 == 1) {
    result.second._M_str = in_whitespace_begin_local;
    end_00._M_current._0_4_ = (uint)*end._M_current;
    end_00._M_current._4_4_ = 0;
    word_split_once<std::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
              (__return_storage_ptr__,(jessilib *)end_local._M_current,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )in_whitespace_begin_local,end_00,in_whitespace);
  }
  else {
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)local_58);
    local_59 = (type)__gnu_cxx::operator<=><char_const*,std::__cxx11::string>
                               (&end_local,
                                (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&in_whitespace_begin_local);
    std::__cmp_cat::__unspec::__unspec(&local_5a,(__unspec *)0x0);
    bVar1 = std::operator>=(local_59);
    if (bVar1) {
      (__return_storage_ptr__->first)._M_len = (size_t)local_58;
      (__return_storage_ptr__->first)._M_str = (char *)result.first._M_len;
      (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
      (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
    }
    else {
      itr._M_current = end._M_current;
      if (end._M_current < in_whitespace_begin) {
        while( true ) {
          bVar1 = __gnu_cxx::
                  operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            (&end_local,
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&in_whitespace_begin_local);
          local_111 = false;
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&end_local);
            local_111 = word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_*,_const_char_*>
                        ::anon_class_16_2_5d41347b::operator()
                                  ((anon_class_16_2_5d41347b *)&itr,*pcVar3);
          }
          if (local_111 == false) break;
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&end_local);
        }
        local_98._M_current = end_local._M_current;
        while( true ) {
          local_99 = (type)__gnu_cxx::operator<=><char_const*,std::__cxx11::string>
                                     (&local_98,
                                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&in_whitespace_begin_local);
          std::__cmp_cat::__unspec::__unspec(&local_9a,(__unspec *)0x0);
          bVar1 = std::operator<(local_99);
          if (!bVar1) break;
          pcVar3 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_98);
          bVar1 = word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_*,_const_char_*>
                  ::anon_class_16_2_5d41347b::operator()((anon_class_16_2_5d41347b *)&itr,*pcVar3);
          if (bVar1) {
            bVar4 = make_word_split_member<std::basic_string_view<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
                              (end_local,local_98);
            local_b0 = bVar4._M_len;
            local_58 = (undefined1  [8])local_b0;
            local_a8 = bVar4._M_str;
            result.first._M_len = (size_t)local_a8;
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&local_98);
            while( true ) {
              bVar1 = __gnu_cxx::
                      operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                (&local_98,
                                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&in_whitespace_begin_local);
              local_112 = false;
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                pcVar3 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_98);
                local_112 = word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_*,_const_char_*>
                            ::anon_class_16_2_5d41347b::operator()
                                      ((anon_class_16_2_5d41347b *)&itr,*pcVar3);
              }
              if (local_112 == false) break;
              __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++(&local_98);
            }
            bVar4 = make_word_split_member<std::basic_string_view<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
                              (local_98,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         )in_whitespace_begin_local);
            local_d0 = bVar4._M_len;
            local_c8 = bVar4._M_str;
            (__return_storage_ptr__->first)._M_len = (size_t)local_58;
            (__return_storage_ptr__->first)._M_str = (char *)result.first._M_len;
            (__return_storage_ptr__->second)._M_len = local_d0;
            (__return_storage_ptr__->second)._M_str = local_c8;
            return __return_storage_ptr__;
          }
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&local_98);
        }
        bVar4 = make_word_split_member<std::basic_string_view<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
                          (end_local,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )in_whitespace_begin_local);
        local_f0 = bVar4._M_len;
        local_e8 = bVar4._M_str;
        (__return_storage_ptr__->first)._M_len = local_f0;
        (__return_storage_ptr__->first)._M_str = local_e8;
        (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
        (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
      }
      else {
        bVar4 = make_word_split_member<std::basic_string_view<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nullptr>
                          (end_local,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )in_whitespace_begin_local);
        local_70 = bVar4._M_len;
        local_68 = bVar4._M_str;
        (__return_storage_ptr__->first)._M_len = local_70;
        (__return_storage_ptr__->first)._M_str = local_68;
        (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
        (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, SpaceItrT in_whitespace_begin, SpaceEndT in_whitespace_end) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using ElementT = std::remove_cvref_t<decltype(*begin)>;
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	if (std::distance(in_whitespace_begin, in_whitespace_end) == 1) {
		return word_split_once<OptionalMemberT...>(begin, end, *in_whitespace_begin);
	}

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	if (in_whitespace_begin >= in_whitespace_end) {
		// Absent whitespace, therefore no match, therefore return input as single token
		result.first = make_word_split_member<MemberT>(begin, end);
		return result;
	}

	auto is_whitespace = [in_whitespace_begin, in_whitespace_end](ElementT in_element) {
		return std::find(in_whitespace_begin, in_whitespace_end, in_element) != in_whitespace_end;
	};

	// Skip over preceeding whitespace
	while (begin != end
		&& is_whitespace(*begin)) {
		++begin;
	}

	for (auto itr = begin; itr < end; ++itr) {
		if (is_whitespace(*itr)) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& is_whitespace(*itr)) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}